

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int poly(double *A,double *B,double *C,int lA,int lB)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar1 = (lA + lB) - 1;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    C[uVar5] = 0.0;
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)lB;
  if (lB < 1) {
    uVar5 = uVar6;
  }
  uVar2 = (ulong)(uint)lA;
  if (lA < 1) {
    uVar2 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    dVar9 = 0.0;
    uVar7 = uVar6;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        if (uVar7 == uVar8) {
          dVar9 = dVar9 + A[uVar3] * B[uVar8];
        }
      }
      uVar7 = uVar7 - 1;
    }
    C[uVar6] = dVar9;
  }
  return uVar1;
}

Assistant:

int poly(double *A, double *B, double *C, int lA, int lB) {
	int lC,i,j,k;
	double temp;
	lC = lA + lB - 1;
	
	for(i = 0; i < lC;++i) {
			C[i] = 0.;
	}
	
	for(i = 0; i < lC;++i) {
		temp = 0.0;
		for(j = 0; j < lA;++j) {
			for(k = 0; k < lB;++k) {
				if (j + k == i) {
					temp += A[j] * B[k];
				}
			}
		}
		C[i] = temp;
			
	}
	
		
	return lC;
}